

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thief.c
# Opt level: O0

void do_counterfeit(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  OBJ_DATA *pOVar4;
  OBJ_DATA *pOVar5;
  char *pcVar6;
  long in_RDI;
  OBJ_AFFECT_DATA oaf;
  int skill;
  char hold [4608];
  char arg2 [4608];
  char arg1 [4608];
  OBJ_DATA *copy;
  OBJ_DATA *orig;
  OBJ_AFFECT_DATA *in_stack_ffffffffffffc978;
  OBJ_DATA *in_stack_ffffffffffffc980;
  CHAR_DATA *in_stack_ffffffffffffc988;
  undefined2 in_stack_ffffffffffffc990;
  undefined2 in_stack_ffffffffffffc992;
  undefined2 uVar7;
  undefined2 in_stack_ffffffffffffc994;
  short sVar8;
  undefined2 in_stack_ffffffffffffc996;
  undefined2 uVar9;
  char *in_stack_ffffffffffffc9a8;
  char local_3628 [124];
  int in_stack_ffffffffffffca54;
  undefined1 in_stack_ffffffffffffca5b;
  int in_stack_ffffffffffffca5c;
  CHAR_DATA *in_stack_ffffffffffffca60;
  int in_stack_ffffffffffffca7c;
  CHAR_DATA *in_stack_ffffffffffffca80;
  CHAR_DATA *in_stack_ffffffffffffdb88;
  char *in_stack_ffffffffffffdb90;
  CHAR_DATA *in_stack_ffffffffffffdb98;
  char local_2428;
  char local_1228;
  
  iVar2 = get_skill(in_stack_ffffffffffffca80,in_stack_ffffffffffffca7c);
  if (iVar2 == 0) {
    send_to_char((char *)CONCAT26(in_stack_ffffffffffffc996,
                                  CONCAT24(in_stack_ffffffffffffc994,
                                           CONCAT22(in_stack_ffffffffffffc992,
                                                    in_stack_ffffffffffffc990))),
                 in_stack_ffffffffffffc988);
  }
  else {
    one_argument((char *)in_stack_ffffffffffffc980,(char *)in_stack_ffffffffffffc978);
    one_argument((char *)in_stack_ffffffffffffc980,(char *)in_stack_ffffffffffffc978);
    if ((local_1228 == '\0') || (local_2428 == '\0')) {
      send_to_char((char *)CONCAT26(in_stack_ffffffffffffc996,
                                    CONCAT24(in_stack_ffffffffffffc994,
                                             CONCAT22(in_stack_ffffffffffffc992,
                                                      in_stack_ffffffffffffc990))),
                   in_stack_ffffffffffffc988);
    }
    else {
      pOVar4 = get_obj_carry(in_stack_ffffffffffffdb98,in_stack_ffffffffffffdb90,
                             in_stack_ffffffffffffdb88);
      if (pOVar4 == (OBJ_DATA *)0x0) {
        send_to_char((char *)CONCAT26(in_stack_ffffffffffffc996,
                                      CONCAT24(in_stack_ffffffffffffc994,
                                               CONCAT22(in_stack_ffffffffffffc992,
                                                        in_stack_ffffffffffffc990))),
                     in_stack_ffffffffffffc988);
      }
      else {
        pOVar5 = get_obj_carry(in_stack_ffffffffffffdb98,in_stack_ffffffffffffdb90,
                               in_stack_ffffffffffffdb88);
        if (pOVar5 == (OBJ_DATA *)0x0) {
          send_to_char((char *)CONCAT26(in_stack_ffffffffffffc996,
                                        CONCAT24(in_stack_ffffffffffffc994,
                                                 CONCAT22(in_stack_ffffffffffffc992,
                                                          in_stack_ffffffffffffc990))),
                       in_stack_ffffffffffffc988);
        }
        else if (pOVar4->item_type == pOVar5->item_type) {
          bVar1 = str_cmp(pOVar4->material,pOVar5->material);
          if (bVar1) {
            send_to_char((char *)CONCAT26(in_stack_ffffffffffffc996,
                                          CONCAT24(in_stack_ffffffffffffc994,
                                                   CONCAT22(in_stack_ffffffffffffc992,
                                                            in_stack_ffffffffffffc990))),
                         in_stack_ffffffffffffc988);
          }
          else {
            iVar3 = number_percent();
            if (iVar3 < iVar2) {
              act((char *)CONCAT26(in_stack_ffffffffffffc996,
                                   CONCAT24(in_stack_ffffffffffffc994,
                                            CONCAT22(in_stack_ffffffffffffc992,
                                                     in_stack_ffffffffffffc990))),
                  in_stack_ffffffffffffc988,in_stack_ffffffffffffc980,in_stack_ffffffffffffc978,0);
              free_pstring((char *)in_stack_ffffffffffffc980);
              pcVar6 = palloc_string(in_stack_ffffffffffffc9a8);
              pOVar5->short_descr = pcVar6;
              free_pstring((char *)in_stack_ffffffffffffc980);
              pcVar6 = palloc_string(in_stack_ffffffffffffc9a8);
              pOVar5->name = pcVar6;
              free_pstring((char *)in_stack_ffffffffffffc980);
              pcVar6 = palloc_string(in_stack_ffffffffffffc9a8);
              pOVar5->description = pcVar6;
              check_improve(in_stack_ffffffffffffca60,in_stack_ffffffffffffca5c,
                            (bool)in_stack_ffffffffffffca5b,in_stack_ffffffffffffca54);
            }
            else {
              act((char *)CONCAT26(in_stack_ffffffffffffc996,
                                   CONCAT24(in_stack_ffffffffffffc994,
                                            CONCAT22(in_stack_ffffffffffffc992,
                                                     in_stack_ffffffffffffc990))),
                  in_stack_ffffffffffffc988,in_stack_ffffffffffffc980,in_stack_ffffffffffffc978,0);
              free_pstring((char *)in_stack_ffffffffffffc980);
              sprintf(local_3628,"a shoddy imitation of %s",pOVar4->short_descr);
              pcVar6 = palloc_string(in_stack_ffffffffffffc9a8);
              pOVar5->short_descr = pcVar6;
              free_pstring((char *)in_stack_ffffffffffffc980);
              pcVar6 = palloc_string(in_stack_ffffffffffffc9a8);
              pOVar5->name = pcVar6;
              free_pstring((char *)in_stack_ffffffffffffc980);
              pcVar6 = palloc_string(in_stack_ffffffffffffc9a8);
              pOVar5->description = pcVar6;
              check_improve(in_stack_ffffffffffffca60,in_stack_ffffffffffffca5c,
                            (bool)in_stack_ffffffffffffca5b,in_stack_ffffffffffffca54);
            }
            init_affect_obj((OBJ_AFFECT_DATA *)0x760258);
            uVar7 = 0;
            uVar9 = *(undefined2 *)(in_RDI + 0x138);
            sVar8 = gsn_counterfeit;
            affect_to_obj(in_stack_ffffffffffffc980,in_stack_ffffffffffffc978);
            WAIT_STATE((CHAR_DATA *)
                       CONCAT26(uVar9,CONCAT24(sVar8,CONCAT22(uVar7,in_stack_ffffffffffffc990))),
                       (int)((ulong)in_RDI >> 0x20));
          }
        }
        else {
          send_to_char((char *)CONCAT26(in_stack_ffffffffffffc996,
                                        CONCAT24(in_stack_ffffffffffffc994,
                                                 CONCAT22(in_stack_ffffffffffffc992,
                                                          in_stack_ffffffffffffc990))),
                       in_stack_ffffffffffffc988);
        }
      }
    }
  }
  return;
}

Assistant:

void do_counterfeit(CHAR_DATA *ch, char *argument)
{
	OBJ_DATA *orig, *copy;
	char arg1[MSL], arg2[MSL], hold[MSL];
	int skill;
	OBJ_AFFECT_DATA oaf;

	skill = get_skill(ch, gsn_counterfeit);

	if (skill == 0)
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	if (arg1[0] == '\0' || arg2[0] == '\0')
	{
		send_to_char("Syntax: counterfeit <original item> <base item for forgery>\n\r", ch);
		return;
	}

	orig = get_obj_carry(ch, arg1, ch);

	if (orig == nullptr)
	{
		send_to_char("You can't find the original item.\n\r", ch);
		return;
	}

	copy = get_obj_carry(ch, arg2, ch);

	if (copy == nullptr)
	{
		send_to_char("You can't find the copy item.\n\r", ch);
		return;
	}

	if (orig->item_type != copy->item_type)
	{
		send_to_char("Even with your skill, you can't make those two look alike.\n\r", ch);
		return;
	}

	if (str_cmp(orig->material, copy->material))
	{
		send_to_char("Those two items are not even the same material.\n\r", ch);
		return;
	}

	if (number_percent() < skill)
	{
		act("You successfully counterfeit $p.", ch, orig, 0, TO_CHAR);

		free_pstring(copy->short_descr);
		copy->short_descr = palloc_string(orig->short_descr);

		free_pstring(copy->name);
		copy->name = palloc_string(orig->name);

		free_pstring(copy->description);
		copy->description = palloc_string(orig->description);

		check_improve(ch, gsn_counterfeit, true, 1);
	}
	else
	{
		act("You botch the counterfeit and ruin $p!", ch, copy, 0, TO_CHAR);

		free_pstring(copy->short_descr);
		sprintf(hold, "a shoddy imitation of %s", orig->short_descr);
		copy->short_descr = palloc_string(hold);

		free_pstring(copy->name);
		copy->name = palloc_string(orig->name);

		free_pstring(copy->description);
		copy->description = palloc_string(orig->description);

		check_improve(ch, gsn_counterfeit, false, 1);
	}

	init_affect_obj(&oaf);
	oaf.where = TO_OBJ_AFFECTS;
	oaf.type = gsn_counterfeit;
	oaf.aftype = AFT_SKILL;
	oaf.level = ch->level;
	oaf.duration = ch->level;
	oaf.owner = ch;
	oaf.end_fun = counterfeit_end;
	affect_to_obj(copy, &oaf);

	WAIT_STATE(ch, PULSE_VIOLENCE * 2);
}